

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall OpenMesh::PolyConnectivity::collapse(PolyConnectivity *this,HalfedgeHandle _hh)

{
  HalfedgeHandle HVar1;
  HalfedgeHandle _heh;
  HalfedgeHandle _heh_00;
  BaseHandle BVar2;
  
  HVar1 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_hh);
  _heh = ArrayKernel::next_halfedge_handle
                   (&this->super_ArrayKernel,
                    (HalfedgeHandle)
                    ((-((uint)_hh.super_BaseHandle.idx_ & 1) | 1) + (int)_hh.super_BaseHandle.idx_))
  ;
  collapse_edge(this,_hh);
  _heh_00 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar1);
  BVar2.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh_00);
  if ((BaseHandle)BVar2.idx_ == HVar1.super_BaseHandle.idx_) {
    HVar1 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar1);
    collapse_loop(this,HVar1);
  }
  HVar1 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh);
  BVar2.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar1);
  if ((BaseHandle)BVar2.idx_ == _heh.super_BaseHandle.idx_) {
    collapse_loop(this,_heh);
    return;
  }
  return;
}

Assistant:

void PolyConnectivity::collapse(HalfedgeHandle _hh)
{
  HalfedgeHandle h0 = _hh;
  HalfedgeHandle h1 = next_halfedge_handle(h0);
  HalfedgeHandle o0 = opposite_halfedge_handle(h0);
  HalfedgeHandle o1 = next_halfedge_handle(o0);

  // remove edge
  collapse_edge(h0);

  // remove loops
  if (next_halfedge_handle(next_halfedge_handle(h1)) == h1)
    collapse_loop(next_halfedge_handle(h1));
  if (next_halfedge_handle(next_halfedge_handle(o1)) == o1)
    collapse_loop(o1);
}